

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loopsubdiv.cpp
# Opt level: O2

Point3f pbrt::weightOneRing(SDVertex *vert,Float beta)

{
  uint uVar1;
  Point3f *pPVar2;
  long lVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [12];
  undefined1 in_ZMM2 [64];
  Tuple3<pbrt::Point3,_float> TVar6;
  Point3<float> PVar7;
  InlinedVector<pbrt::Point3<float>,_16,_pstd::pmr::polymorphic_allocator<pbrt::Point3<float>_>_>
  pRing;
  float local_120;
  undefined8 local_118;
  polymorphic_allocator<pbrt::Point3<float>_> local_108;
  undefined1 local_100 [224];
  
  auVar5 = in_ZMM2._4_12_;
  uVar1 = SDVertex::valence(vert);
  local_108.memoryResource = pstd::pmr::new_delete_resource();
  InlinedVector<pbrt::Point3<float>,_16,_pstd::pmr::polymorphic_allocator<pbrt::Point3<float>_>_>::
  InlinedVector((InlinedVector<pbrt::Point3<float>,_16,_pstd::pmr::polymorphic_allocator<pbrt::Point3<float>_>_>
                 *)local_100,(long)(int)uVar1,&local_108);
  pPVar2 = (Point3f *)local_100._8_8_;
  if ((Point3f *)local_100._8_8_ == (Point3f *)0x0) {
    pPVar2 = (Point3f *)(local_100 + 0x10);
  }
  SDVertex::oneRing(vert,pPVar2);
  auVar4._0_4_ = (float)(int)uVar1;
  auVar4._4_12_ = auVar5;
  auVar4 = vfnmadd213ss_fma(auVar4,ZEXT416((uint)beta),ZEXT416(0x3f800000));
  TVar6 = (Tuple3<pbrt::Point3,_float>)
          Tuple3<pbrt::Point3,float>::operator*((Tuple3<pbrt::Point3,float> *)vert,auVar4._0_4_);
  lVar3 = 0;
  while( true ) {
    local_120 = TVar6.z;
    if ((ulong)(~((int)uVar1 >> 0x1f) & uVar1) * 0xc - lVar3 == 0) break;
    pPVar2 = (Point3f *)local_100._8_8_;
    if ((Point3f *)local_100._8_8_ == (Point3f *)0x0) {
      pPVar2 = (Point3f *)(local_100 + 0x10);
    }
    PVar7 = Tuple3<pbrt::Point3,float>::operator*
                      ((Tuple3<pbrt::Point3,float> *)
                       ((long)&(pPVar2->super_Tuple3<pbrt::Point3,_float>).x + lVar3),beta);
    local_118._0_4_ = TVar6.x;
    local_118._4_4_ = TVar6.y;
    lVar3 = lVar3 + 0xc;
    TVar6.z = local_120 + PVar7.super_Tuple3<pbrt::Point3,_float>.z;
    TVar6.x = (float)local_118 + PVar7.super_Tuple3<pbrt::Point3,_float>.x;
    TVar6.y = local_118._4_4_ + PVar7.super_Tuple3<pbrt::Point3,_float>.y;
  }
  InlinedVector<pbrt::Point3<float>,_16,_pstd::pmr::polymorphic_allocator<pbrt::Point3<float>_>_>::
  ~InlinedVector((InlinedVector<pbrt::Point3<float>,_16,_pstd::pmr::polymorphic_allocator<pbrt::Point3<float>_>_>
                  *)local_100);
  return (Point3f)TVar6;
}

Assistant:

static Point3f weightOneRing(SDVertex *vert, Float beta) {
    // Put _vert_ one-ring in _pRing_
    int valence = vert->valence();
    InlinedVector<Point3f, 16> pRing(valence);

    vert->oneRing(pRing.data());
    Point3f p = (1 - valence * beta) * vert->p;
    for (int i = 0; i < valence; ++i)
        p += beta * pRing[i];
    return p;
}